

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void stbtt__sort_edges_ins_sort(stbtt__edge *p,int n)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  stbtt__edge *psVar7;
  stbtt__edge *psVar8;
  int c;
  stbtt__edge *b;
  stbtt__edge *a;
  stbtt__edge t;
  int j;
  int i;
  int n_local;
  stbtt__edge *p_local;
  
  for (i = 1; i < n; i = i + 1) {
    psVar7 = p + i;
    uVar2 = psVar7->x0;
    uVar3 = psVar7->y0;
    fVar5 = psVar7->x1;
    fVar6 = psVar7->y1;
    iVar1 = psVar7->invert;
    j = i;
    while ((0 < j && ((float)uVar3 < p[j + -1].y0))) {
      psVar7 = p + j;
      psVar8 = p + (j + -1);
      fVar4 = psVar8->y0;
      psVar7->x0 = psVar8->x0;
      psVar7->y0 = fVar4;
      fVar4 = psVar8->y1;
      psVar7->x1 = psVar8->x1;
      psVar7->y1 = fVar4;
      psVar7->invert = psVar8->invert;
      j = j + -1;
    }
    if (i != j) {
      psVar7 = p + j;
      psVar7->x0 = (float)uVar2;
      psVar7->y0 = (float)uVar3;
      psVar7->x1 = fVar5;
      psVar7->y1 = fVar6;
      psVar7->invert = iVar1;
    }
  }
  return;
}

Assistant:

static void stbtt__sort_edges_ins_sort(stbtt__edge *p, int n)
{
int i,j;
for (i=1; i < n; ++i) {
stbtt__edge t = p[i], *a = &t;
j = i;
while (j > 0) {
stbtt__edge *b = &p[j-1];
int c = STBTT__COMPARE(a,b);
if (!c) break;
p[j] = p[j-1];
--j;
}
if (i != j)
p[j] = t;
}
}